

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCnf.c
# Opt level: O1

int Pdr_ManFreeVar(Pdr_Man_t *p,int k)

{
  Vec_Int_t *p_00;
  int iVar1;
  
  if (p->pPars->fMonoCnf == 0) {
    if ((-1 < k) && (k < (p->vVar2Ids).nSize)) {
      p_00 = (Vec_Int_t *)(p->vVar2Ids).pArray[(uint)k];
      Vec_IntPush(p_00,-1);
      return p_00->nSize + -1;
    }
  }
  else if ((-1 < k) && (k < p->vSolvers->nSize)) {
    iVar1 = sat_solver_nvars((sat_solver *)p->vSolvers->pArray[(uint)k]);
    return iVar1;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Pdr_ManFreeVar( Pdr_Man_t * p, int k )
{
    if ( p->pPars->fMonoCnf )
        return sat_solver_nvars( Pdr_ManSolver(p, k) );
    else
    {
        Vec_Int_t * vVar2Ids = (Vec_Int_t *)Vec_PtrEntry( &p->vVar2Ids, k );
        Vec_IntPush( vVar2Ids, -1 );
        return Vec_IntSize( vVar2Ids ) - 1;
    }
}